

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * sqlite3ExprForVectorField(Parse *pParse,Expr *pVector,int iField)

{
  Expr *pEVar1;
  RenameToken *pRVar2;
  
  if (pVector->op == 0xa9) {
    pVector = ((pVector->x).pList)->a[iField].pExpr;
  }
  else if (pVector->op == 0x83) {
    pEVar1 = sqlite3PExpr(pParse,0xaa,(Expr *)0x0,(Expr *)0x0);
    if (pEVar1 == (Expr *)0x0) {
      return (Expr *)0x0;
    }
    pEVar1->iColumn = (ynVar)iField;
    pEVar1->pLeft = pVector;
    return pEVar1;
  }
  if (pVector == (Expr *)0x0) {
    pEVar1 = (Expr *)0x0;
  }
  else {
    pEVar1 = exprDup(pParse->db,pVector,0,(u8 **)0x0);
  }
  pRVar2 = pParse->pRename;
  while( true ) {
    if (pRVar2 == (RenameToken *)0x0) {
      return pEVar1;
    }
    if ((Expr *)pRVar2->p == pVector) break;
    pRVar2 = pRVar2->pNext;
  }
  pRVar2->p = pEVar1;
  return pEVar1;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprForVectorField(
  Parse *pParse,       /* Parsing context */
  Expr *pVector,       /* The vector.  List of expressions or a sub-SELECT */
  int iField           /* Which column of the vector to return */
){
  Expr *pRet;
  if( pVector->op==TK_SELECT ){
    assert( pVector->flags & EP_xIsSelect );
    /* The TK_SELECT_COLUMN Expr node:
    **
    ** pLeft:           pVector containing TK_SELECT.  Not deleted.
    ** pRight:          not used.  But recursively deleted.
    ** iColumn:         Index of a column in pVector
    ** iTable:          0 or the number of columns on the LHS of an assignment
    ** pLeft->iTable:   First in an array of register holding result, or 0
    **                  if the result is not yet computed.
    **
    ** sqlite3ExprDelete() specifically skips the recursive delete of
    ** pLeft on TK_SELECT_COLUMN nodes.  But pRight is followed, so pVector
    ** can be attached to pRight to cause this node to take ownership of
    ** pVector.  Typically there will be multiple TK_SELECT_COLUMN nodes
    ** with the same pLeft pointer to the pVector, but only one of them
    ** will own the pVector.
    */
    pRet = sqlite3PExpr(pParse, TK_SELECT_COLUMN, 0, 0);
    if( pRet ){
      pRet->iColumn = iField;
      pRet->pLeft = pVector;
    }
    assert( pRet==0 || pRet->iTable==0 );
  }else{
    if( pVector->op==TK_VECTOR ) pVector = pVector->x.pList->a[iField].pExpr;
    pRet = sqlite3ExprDup(pParse->db, pVector, 0);
    sqlite3RenameTokenRemap(pParse, pRet, pVector);
  }
  return pRet;
}